

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::New
          (ArenaAllocator *alloc,int increment)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc_00;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  TrackAllocData local_40;
  int local_14;
  ArenaAllocator *pAStack_10;
  int increment_local;
  ArenaAllocator *alloc_local;
  
  local_14 = increment;
  pAStack_10 = alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &List<void*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
             ,0x12e);
  alloc_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_40);
  this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
         new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)alloc_00,0x3f67b0);
  List(this,pAStack_10,local_14);
  return this;
}

Assistant:

static List * New(TAllocator * alloc, int increment = DefaultIncrement)
        {
            return AllocatorNew(TAllocator, alloc, List, alloc, increment);
        }